

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

bool operator==(TargetDependsClosureKey *lhs,TargetDependsClosureKey *rhs)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  if (lhs->Target != rhs->Target) {
    return false;
  }
  __n = (lhs->Config)._M_string_length;
  if (__n == (rhs->Config)._M_string_length) {
    if (__n != 0) {
      iVar1 = bcmp((lhs->Config)._M_dataplus._M_p,(rhs->Config)._M_dataplus._M_p,__n);
      if (iVar1 != 0) goto LAB_003d8565;
    }
    bVar2 = lhs->GenexOutput == rhs->GenexOutput;
  }
  else {
LAB_003d8565:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator==(
  const cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey& lhs,
  const cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey& rhs)
{
  return lhs.Target == rhs.Target && lhs.Config == rhs.Config &&
    lhs.GenexOutput == rhs.GenexOutput;
}